

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeCasts.cpp
# Opt level: O2

void __thiscall
wasm::anon_unknown_237::FindingApplier::handleRefinement(FindingApplier *this,Expression *curr)

{
  long *plVar1;
  long lVar2;
  Function *pFVar3;
  Index index;
  iterator iVar4;
  LocalSet *pLVar5;
  iterator __it;
  mapped_type *pmVar6;
  long *plVar7;
  unordered_map<wasm::Expression_*,_wasm::Function::DebugLocation,_std::hash<wasm::Expression_*>,_std::equal_to<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>_>
  *this_00;
  Expression *local_50;
  Expression *curr_1;
  LocalSet *local_40;
  undefined8 local_38;
  BinaryLocation local_30;
  Expression *local_28;
  Expression *curr_local;
  
  local_28 = curr;
  iVar4 = std::
          _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_std::allocator<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->finder->lessCastedGets)._M_h,&local_28);
  if (iVar4.
      super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
      ._M_cur != (__node_type *)0x0) {
    index = Builder::addVar((this->
                            super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            ).
                            super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                            .currFunction,(Type)(local_28->type).id);
    plVar1 = *(long **)((long)iVar4.
                              super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                              ._M_cur + 0x18);
    for (plVar7 = *(long **)((long)iVar4.
                                   super__Node_iterator_base<std::pair<wasm::Expression_*const,_std::vector<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>_>,_false>
                                   ._M_cur + 0x10); plVar7 != plVar1; plVar7 = plVar7 + 1) {
      lVar2 = *plVar7;
      *(Index *)(lVar2 + 0x10) = index;
      *(uintptr_t *)(lVar2 + 8) = (local_28->type).id;
    }
    curr_1 = (Expression *)
             (this->
             super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             .currModule;
    pLVar5 = Builder::makeLocalTee((Builder *)&curr_1,index,local_28,(Type)(local_28->type).id);
    pFVar3 = (this->
             super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             ).
             super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
             .currFunction;
    if ((pFVar3 != (Function *)0x0) && ((pFVar3->debugLocations)._M_h._M_element_count != 0)) {
      this_00 = &pFVar3->debugLocations;
      local_50 = *(this->
                  super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                  ).
                  super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
                  .replacep;
      local_40 = pLVar5;
      __it = std::
             _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             ::find(&this_00->_M_h,&local_50);
      if (__it.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
          ._M_cur != (__node_type *)0x0) {
        local_30 = *(BinaryLocation *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                           ._M_cur + 0x18);
        local_38 = *(undefined8 *)
                    ((long)__it.
                           super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                           ._M_cur + 0x10);
        std::
        _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::erase(&this_00->_M_h,
                (const_iterator)
                __it.
                super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_false>
                ._M_cur);
        pmVar6 = std::__detail::
                 _Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Function::DebugLocation>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)this_00,(key_type *)&local_40);
        pmVar6->columnNumber = local_30;
        pmVar6->fileIndex = (undefined4)local_38;
        pmVar6->lineNumber = local_38._4_4_;
        pLVar5 = local_40;
      }
    }
    *(this->
     super_PostWalker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     ).
     super_Walker<wasm::(anonymous_namespace)::FindingApplier,_wasm::Visitor<wasm::(anonymous_namespace)::FindingApplier,_void>_>
     .replacep = (Expression *)pLVar5;
  }
  return;
}

Assistant:

void handleRefinement(Expression* curr) {
    auto iter = finder.lessCastedGets.find(curr);
    if (iter == finder.lessCastedGets.end()) {
      return;
    }

    // This expression was the best cast for some gets. Add a new local to
    // store this value, then use it for the gets.
    auto var = Builder::addVar(getFunction(), curr->type);
    auto& gets = iter->second;
    for (auto* get : gets) {
      get->index = var;
      get->type = curr->type;
    }

    // Replace ourselves with a tee.
    replaceCurrent(Builder(*getModule()).makeLocalTee(var, curr, curr->type));
  }